

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall
re2::SimplifyWalker::PostVisit
          (SimplifyWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  ParseFlags PVar4;
  int iVar5;
  RegexpOp RVar6;
  ParseFlags PVar7;
  Regexp **ppRVar8;
  Regexp *pRVar9;
  ostream *poVar10;
  ostream *this_00;
  size_t in_stack_fffffffffffffd50;
  LogMessage local_220;
  Regexp *nre_4;
  Regexp *nre_3;
  Regexp *newsub_2;
  Regexp *nre_2;
  Regexp *newsub_1;
  Regexp *nre_1;
  Regexp *newsub;
  Regexp **ppRStack_60;
  int i;
  Regexp **nre_subs;
  Regexp *local_48;
  Regexp *nre;
  Regexp **ppRStack_38;
  int nchild_args_local;
  Regexp **child_args_local;
  Regexp *pre_arg_local;
  Regexp *parent_arg_local;
  Regexp *re_local;
  SimplifyWalker *this_local;
  
  nre._4_4_ = nchild_args;
  ppRStack_38 = child_args;
  child_args_local = (Regexp **)pre_arg;
  pre_arg_local = parent_arg;
  parent_arg_local = re;
  re_local = (Regexp *)this;
  RVar2 = Regexp::op(re);
  switch(RVar2) {
  case kRegexpNoMatch:
  case kRegexpEmptyMatch:
  case kRegexpLiteral:
  case kRegexpLiteralString:
  case kRegexpAnyChar:
  case kRegexpAnyByte:
  case kRegexpBeginLine:
  case kRegexpEndLine:
  case kRegexpWordBoundary:
  case kRegexpNoWordBoundary:
  case kRegexpBeginText:
  case kRegexpEndText:
  case kMaxRegexpOp:
    parent_arg_local->simple_ = '\x01';
    this_local = (SimplifyWalker *)Regexp::Incref(parent_arg_local);
    break;
  case kRegexpConcat:
  case kRegexpAlternate:
    bVar1 = ChildArgsChanged(parent_arg_local,ppRStack_38);
    if (bVar1) {
      pRVar9 = (Regexp *)operator_new(in_stack_fffffffffffffd50);
      RVar2 = Regexp::op(parent_arg_local);
      PVar4 = Regexp::parse_flags(parent_arg_local);
      Regexp::Regexp(pRVar9,RVar2,PVar4);
      local_48 = pRVar9;
      iVar5 = Regexp::nsub(parent_arg_local);
      Regexp::AllocSub(pRVar9,iVar5);
      ppRStack_60 = Regexp::sub(local_48);
      for (newsub._4_4_ = 0; iVar5 = newsub._4_4_, iVar3 = Regexp::nsub(parent_arg_local),
          iVar5 < iVar3; newsub._4_4_ = newsub._4_4_ + 1) {
        ppRStack_60[newsub._4_4_] = ppRStack_38[newsub._4_4_];
      }
      local_48->simple_ = '\x01';
      this_local = (SimplifyWalker *)local_48;
    }
    else {
      parent_arg_local->simple_ = '\x01';
      this_local = (SimplifyWalker *)Regexp::Incref(parent_arg_local);
    }
    break;
  case kRegexpStar:
  case kRegexpPlus:
  case kRegexpQuest:
    nre_2 = *ppRStack_38;
    RVar2 = Regexp::op(nre_2);
    pRVar9 = nre_2;
    if (RVar2 == kRegexpEmptyMatch) {
      this_local = (SimplifyWalker *)nre_2;
    }
    else {
      ppRVar8 = Regexp::sub(parent_arg_local);
      if (pRVar9 == *ppRVar8) {
        Regexp::Decref(nre_2);
        parent_arg_local->simple_ = '\x01';
        this_local = (SimplifyWalker *)Regexp::Incref(parent_arg_local);
      }
      else {
        RVar2 = Regexp::op(parent_arg_local);
        RVar6 = Regexp::op(nre_2);
        if (RVar2 == RVar6) {
          PVar4 = Regexp::parse_flags(parent_arg_local);
          PVar7 = Regexp::parse_flags(nre_2);
          if (PVar4 == PVar7) {
            return nre_2;
          }
        }
        pRVar9 = (Regexp *)operator_new(in_stack_fffffffffffffd50);
        RVar2 = Regexp::op(parent_arg_local);
        PVar4 = Regexp::parse_flags(parent_arg_local);
        Regexp::Regexp(pRVar9,RVar2,PVar4);
        newsub_2 = pRVar9;
        Regexp::AllocSub(pRVar9,1);
        pRVar9 = nre_2;
        ppRVar8 = Regexp::sub(newsub_2);
        *ppRVar8 = pRVar9;
        newsub_2->simple_ = '\x01';
        this_local = (SimplifyWalker *)newsub_2;
      }
    }
    break;
  case kRegexpRepeat:
    nre_3 = *ppRStack_38;
    RVar2 = Regexp::op(nre_3);
    if (RVar2 == kRegexpEmptyMatch) {
      this_local = (SimplifyWalker *)nre_3;
    }
    else {
      iVar5 = (parent_arg_local->field_7).field_0.min_;
      iVar3 = (parent_arg_local->field_7).field_0.max_;
      pRVar9 = nre_3;
      PVar4 = Regexp::parse_flags(parent_arg_local);
      nre_4 = SimplifyRepeat(pRVar9,iVar5,iVar3,PVar4);
      Regexp::Decref(nre_3);
      nre_4->simple_ = '\x01';
      this_local = (SimplifyWalker *)nre_4;
    }
    break;
  case kRegexpCapture:
    pRVar9 = *ppRStack_38;
    nre_1 = pRVar9;
    ppRVar8 = Regexp::sub(parent_arg_local);
    if (pRVar9 == *ppRVar8) {
      Regexp::Decref(nre_1);
      parent_arg_local->simple_ = '\x01';
      this_local = (SimplifyWalker *)Regexp::Incref(parent_arg_local);
    }
    else {
      pRVar9 = (Regexp *)operator_new(in_stack_fffffffffffffd50);
      PVar4 = Regexp::parse_flags(parent_arg_local);
      Regexp::Regexp(pRVar9,kRegexpCapture,PVar4);
      newsub_1 = pRVar9;
      Regexp::AllocSub(pRVar9,1);
      pRVar9 = nre_1;
      ppRVar8 = Regexp::sub(newsub_1);
      *ppRVar8 = pRVar9;
      iVar5 = Regexp::cap(parent_arg_local);
      (newsub_1->field_7).field_0.max_ = iVar5;
      newsub_1->simple_ = '\x01';
      this_local = (SimplifyWalker *)newsub_1;
    }
    break;
  case kRegexpCharClass:
    this_local = (SimplifyWalker *)SimplifyCharClass(parent_arg_local);
    ((Regexp *)this_local)->simple_ = '\x01';
    break;
  default:
    LogMessage::LogMessage
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/simplify.cc"
               ,0x237);
    poVar10 = LogMessage::stream(&local_220);
    this_00 = std::operator<<((ostream *)poVar10,"Simplify case not handled: ");
    RVar2 = Regexp::op(parent_arg_local);
    std::ostream::operator<<(this_00,RVar2);
    LogMessage::~LogMessage(&local_220);
    this_local = (SimplifyWalker *)Regexp::Incref(parent_arg_local);
  }
  return (Regexp *)this_local;
}

Assistant:

Regexp* SimplifyWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  switch (re->op()) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      // All these are always simple.
      re->simple_ = true;
      return re->Incref();

    case kRegexpConcat:
    case kRegexpAlternate: {
      // These are simple as long as the subpieces are simple.
      if (!ChildArgsChanged(re, child_args)) {
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(re->nsub());
      Regexp** nre_subs = nre->sub();
      for (int i = 0; i < re->nsub(); i++)
        nre_subs[i] = child_args[i];
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCapture: {
      Regexp* newsub = child_args[0];
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(kRegexpCapture, re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->cap_ = re->cap();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      // These are simple as long as the subpiece is simple.
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }

      // These are also idempotent if flags are constant.
      if (re->op() == newsub->op() &&
          re->parse_flags() == newsub->parse_flags())
        return newsub;

      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->simple_ = true;
      return nre;
    }

    case kRegexpRepeat: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      Regexp* nre = SimplifyRepeat(newsub, re->min_, re->max_,
                                   re->parse_flags());
      newsub->Decref();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCharClass: {
      Regexp* nre = SimplifyCharClass(re);
      nre->simple_ = true;
      return nre;
    }
  }

  LOG(ERROR) << "Simplify case not handled: " << re->op();
  return re->Incref();
}